

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

uint8_t * svb_decode_scalar(uint32_t *outPtr,uint8_t *keyPtr,uint8_t *dataPtr,uint32_t count)

{
  uint32_t uVar1;
  byte *pbVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint8_t *local_38;
  
  if (count != 0) {
    uVar3 = (uint)*keyPtr;
    pbVar2 = keyPtr + 1;
    uVar5 = 0;
    local_38 = dataPtr;
    for (lVar4 = 0; dataPtr = local_38, count != (uint32_t)lVar4; lVar4 = lVar4 + 1) {
      if ((char)uVar5 == '\b') {
        uVar3 = (uint)*pbVar2;
        pbVar2 = pbVar2 + 1;
        uVar5 = 0;
      }
      uVar1 = _decode_data(&local_38,(byte)(uVar3 >> (uVar5 & 0x1f)) & 3);
      outPtr[lVar4] = uVar1;
      uVar5 = (uint)(byte)((char)uVar5 + 2);
    }
  }
  return dataPtr;
}

Assistant:

uint8_t *svb_decode_scalar(uint32_t *outPtr, const uint8_t *keyPtr,
                           uint8_t *dataPtr, uint32_t count) {
  if (count == 0)
    return dataPtr; // no reads or writes if no data

  uint8_t shift = 0;
  uint32_t key = *keyPtr++;
  for (uint32_t c = 0; c < count; c++) {
    if (shift == 8) {
      shift = 0;
      key = *keyPtr++;
    }
    uint32_t val = _decode_data(&dataPtr, (key >> shift) & 0x3);
    *outPtr++ = val;
    shift += 2;
  }

  return dataPtr; // pointer to first unused byte after end
}